

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::PostStep::PostStep(PostStep *this,PostStep *old)

{
  shared_ptr<soplex::Tolerances> *in_RSI;
  shared_ptr<soplex::Tolerances> *in_RDI;
  
  (in_RDI->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__PostStep_0089fd80;
  (in_RDI->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (in_RSI->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  *(undefined4 *)
   &in_RDI[1].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(undefined4 *)
        &in_RSI[1].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined4 *)
   ((long)&in_RDI[1].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
       = *(undefined4 *)
          ((long)&in_RSI[1].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 4);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x71dce1);
  std::shared_ptr<soplex::Tolerances>::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

PostStep(const PostStep& old)
         : m_name(old.m_name)
         , nCols(old.nCols)
         , nRows(old.nRows)
      {
         _tolerances = old._tolerances;
      }